

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_aat.c
# Opt level: O3

size_t amd_l_aat(longlong n,longlong *Ap,longlong *Ai,longlong *Len,longlong *Tp,c_float *Info)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  c_float cVar14;
  undefined1 auVar15 [16];
  
  if (Info != (c_float *)0x0) {
    lVar4 = 0;
    do {
      Info[lVar4] = -1.0;
      (Info + lVar4)[1] = -1.0;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x14);
    *Info = 0.0;
  }
  if (n < 1) {
    lVar4 = Ap[n];
    dVar13 = 0.0;
    lVar7 = 0;
  }
  else {
    lVar10 = 0;
    memset(Len,0,n * 8);
    lVar4 = Ap[n];
    lVar7 = 0;
    lVar5 = 0;
    do {
      lVar8 = Ap[lVar5];
      lVar1 = Ap[lVar5 + 1];
      lVar9 = lVar8;
      if (lVar8 < lVar1) {
        do {
          lVar2 = Ai[lVar8];
          if (lVar5 <= lVar2) {
            lVar9 = lVar8;
            if (lVar2 == lVar5) {
              lVar7 = lVar7 + 1;
              lVar9 = lVar8 + 1;
            }
            break;
          }
          Len[lVar2] = Len[lVar2] + 1;
          Len[lVar5] = Len[lVar5] + 1;
          lVar9 = Ap[lVar2 + 1];
          lVar11 = Tp[lVar2];
          lVar12 = lVar11;
          if (lVar11 < lVar9) {
            do {
              lVar3 = Ai[lVar11];
              if (lVar5 <= lVar3) {
                lVar12 = lVar11;
                if (lVar3 == lVar5) {
                  lVar10 = lVar10 + 1;
                  lVar12 = lVar11 + 1;
                }
                break;
              }
              Len[lVar3] = Len[lVar3] + 1;
              Len[lVar2] = Len[lVar2] + 1;
              lVar11 = lVar11 + 1;
              lVar12 = lVar9;
            } while (lVar9 != lVar11);
          }
          lVar8 = lVar8 + 1;
          Tp[lVar2] = lVar12;
          lVar9 = lVar1;
        } while (lVar8 != lVar1);
      }
      Tp[lVar5] = lVar9;
      lVar5 = lVar5 + 1;
    } while (lVar5 != n);
    dVar13 = (double)lVar10 + (double)lVar10;
    if (0 < n) {
      lVar5 = 0;
      do {
        lVar10 = Tp[lVar5];
        lVar8 = lVar5 + 1;
        if (lVar10 < Ap[lVar5 + 1]) {
          do {
            Len[Ai[lVar10]] = Len[Ai[lVar10]] + 1;
            Len[lVar5] = Len[lVar5] + 1;
            lVar10 = lVar10 + 1;
          } while (lVar10 < Ap[lVar8]);
        }
        lVar5 = lVar8;
      } while (lVar8 != n);
    }
  }
  if (lVar4 - lVar7 == 0) {
    cVar14 = 1.0;
  }
  else {
    cVar14 = dVar13 / (double)(lVar4 - lVar7);
  }
  sVar6 = 0;
  if (0 < n) {
    lVar5 = 0;
    do {
      sVar6 = sVar6 + Len[lVar5];
      lVar5 = lVar5 + 1;
    } while (n != lVar5);
  }
  if (Info != (c_float *)0x0) {
    *Info = 0.0;
    Info[1] = (double)n;
    Info[2] = (double)lVar4;
    Info[3] = cVar14;
    Info[4] = (double)lVar7;
    auVar15._8_4_ = (int)(sVar6 >> 0x20);
    auVar15._0_8_ = sVar6;
    auVar15._12_4_ = 0x45300000;
    Info[5] = (auVar15._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0);
  }
  return sVar6;
}

Assistant:

GLOBAL size_t AMD_aat	/* returns nz in A+A' */
(
    Int n,
    const Int Ap [ ],
    const Int Ai [ ],
    Int Len [ ],	/* Len [j]: length of column j of A+A', excl diagonal*/
    Int Tp [ ],		/* workspace of size n */
    c_float Info [ ]
)
{
    Int p1, p2, p, i, j, pj, pj2, k, nzdiag, nzboth, nz ;
    c_float sym ;
    size_t nzaat ;

#ifndef NDEBUG
    AMD_debug_init ("AMD AAT") ;
    for (k = 0 ; k < n ; k++) Tp [k] = EMPTY ;
    ASSERT (AMD_valid (n, n, Ap, Ai) == AMD_OK) ;
#endif

    if (Info != (c_float *) NULL)
    {
	/* clear the Info array, if it exists */
	for (i = 0 ; i < AMD_INFO ; i++)
	{
	    Info [i] = EMPTY ;
	}
	Info [AMD_STATUS] = AMD_OK ;
    }

    for (k = 0 ; k < n ; k++)
    {
	Len [k] = 0 ;
    }

    nzdiag = 0 ;
    nzboth = 0 ;
    nz = Ap [n] ;

    for (k = 0 ; k < n ; k++)
    {
	p1 = Ap [k] ;
	p2 = Ap [k+1] ;
	AMD_DEBUG2 (("\nAAT Column: "ID" p1: "ID" p2: "ID"\n", k, p1, p2)) ;

	/* construct A+A' */
	for (p = p1 ; p < p2 ; )
	{
	    /* scan the upper triangular part of A */
	    j = Ai [p] ;
	    if (j < k)
	    {
		/* entry A (j,k) is in the strictly upper triangular part,
		 * add both A (j,k) and A (k,j) to the matrix A+A' */
		Len [j]++ ;
		Len [k]++ ;
		AMD_DEBUG3 (("    upper ("ID","ID") ("ID","ID")\n", j,k, k,j));
		p++ ;
	    }
	    else if (j == k)
	    {
		/* skip the diagonal */
		p++ ;
		nzdiag++ ;
		break ;
	    }
	    else /* j > k */
	    {
		/* first entry below the diagonal */
		break ;
	    }
	    /* scan lower triangular part of A, in column j until reaching
	     * row k.  Start where last scan left off. */
	    ASSERT (Tp [j] != EMPTY) ;
	    ASSERT (Ap [j] <= Tp [j] && Tp [j] <= Ap [j+1]) ;
	    pj2 = Ap [j+1] ;
	    for (pj = Tp [j] ; pj < pj2 ; )
	    {
		i = Ai [pj] ;
		if (i < k)
		{
		    /* A (i,j) is only in the lower part, not in upper.
		     * add both A (i,j) and A (j,i) to the matrix A+A' */
		    Len [i]++ ;
		    Len [j]++ ;
		    AMD_DEBUG3 (("    lower ("ID","ID") ("ID","ID")\n",
			i,j, j,i)) ;
		    pj++ ;
		}
		else if (i == k)
		{
		    /* entry A (k,j) in lower part and A (j,k) in upper */
		    pj++ ;
		    nzboth++ ;
		    break ;
		}
		else /* i > k */
		{
		    /* consider this entry later, when k advances to i */
		    break ;
		}
	    }
	    Tp [j] = pj ;
	}
	/* Tp [k] points to the entry just below the diagonal in column k */
	Tp [k] = p ;
    }

    /* clean up, for remaining mismatched entries */
    for (j = 0 ; j < n ; j++)
    {
	for (pj = Tp [j] ; pj < Ap [j+1] ; pj++)
	{
	    i = Ai [pj] ;
	    /* A (i,j) is only in the lower part, not in upper.
	     * add both A (i,j) and A (j,i) to the matrix A+A' */
	    Len [i]++ ;
	    Len [j]++ ;
	    AMD_DEBUG3 (("    lower cleanup ("ID","ID") ("ID","ID")\n",
		i,j, j,i)) ;
	}
    }

    /* --------------------------------------------------------------------- */
    /* compute the symmetry of the nonzero pattern of A */
    /* --------------------------------------------------------------------- */

    /* Given a matrix A, the symmetry of A is:
     *	B = tril (spones (A), -1) + triu (spones (A), 1) ;
     *  sym = nnz (B & B') / nnz (B) ;
     *  or 1 if nnz (B) is zero.
     */

    if (nz == nzdiag)
    {
	sym = 1 ;
    }
    else
    {
	sym = (2 * (c_float) nzboth) / ((c_float) (nz - nzdiag)) ;
    }

    nzaat = 0 ;
    for (k = 0 ; k < n ; k++)
    {
	nzaat += Len [k] ;
    }

    AMD_DEBUG1 (("AMD nz in A+A', excluding diagonal (nzaat) = %g\n",
	(c_float) nzaat)) ;
    AMD_DEBUG1 (("   nzboth: "ID" nz: "ID" nzdiag: "ID" symmetry: %g\n",
		nzboth, nz, nzdiag, sym)) ;

    if (Info != (c_float *) NULL)
    {
	Info [AMD_STATUS] = AMD_OK ;
	Info [AMD_N] = n ;
	Info [AMD_NZ] = nz ;
	Info [AMD_SYMMETRY] = sym ;	    /* symmetry of pattern of A */
	Info [AMD_NZDIAG] = nzdiag ;	    /* nonzeros on diagonal of A */
	Info [AMD_NZ_A_PLUS_AT] = nzaat ;   /* nonzeros in A+A' */
    }

    return (nzaat) ;
}